

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O3

int getPixelInterpolated(gdImagePtr im,double x,double y,int bgColor)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  double *pdVar12;
  long lVar13;
  int iVar14;
  bool bVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double kernel_y [4];
  double kernel_x [12];
  uint local_134;
  double adStack_b8 [4];
  double local_98 [13];
  
  if (im->interpolation_id == GD_NEAREST_NEIGHBOUR) {
    return -1;
  }
  iVar9 = (int)x;
  iVar14 = (int)y;
  if (im->interpolation_id != GD_WEIGHTED4) {
    if (im->interpolation == (interpolation_method)0x0) {
      return -1;
    }
    iVar2 = iVar9 + -1;
    iVar8 = iVar14 + -1;
    lVar11 = 0;
    do {
      dVar16 = (*im->interpolation)((double)((int)lVar11 + iVar2) - x);
      local_98[lVar11] = dVar16;
      dVar16 = (*im->interpolation)((double)(iVar8 + (int)lVar11) - y);
      adStack_b8[lVar11] = dVar16;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    uVar7 = 0x7f000000;
    if (bgColor != -1) {
      uVar7 = bgColor;
    }
    dVar16 = 0.0;
    dVar19 = 0.0;
    dVar17 = 0.0;
    dVar20 = 0.0;
    lVar11 = (long)iVar8;
    do {
      dVar21 = adStack_b8[lVar11 - iVar8];
      if (im->trueColor == 0) {
        pdVar12 = local_98;
        lVar13 = (long)iVar2 + -1;
        iVar10 = iVar2;
        do {
          iVar3 = gdImageBoundsSafe(im,iVar10,(int)lVar11);
          uVar6 = bgColor;
          if ((iVar3 != 0) &&
             (bVar1 = im->pixels[lVar11][lVar13 + 1], uVar6 = uVar7, im->transparent != (uint)bVar1)
             ) {
            uVar6 = im->green[bVar1] * 0x100 +
                    im->red[bVar1] * 0x10000 + im->alpha[bVar1] * 0x1000000 + im->blue[bVar1];
          }
          dVar18 = *pdVar12 * dVar21;
          dVar20 = dVar20 + (double)(uVar6 >> 0x10 & 0xff) * dVar18;
          dVar17 = dVar17 + (double)(uVar6 >> 8 & 0xff) * dVar18;
          dVar19 = dVar19 + (double)(uVar6 & 0xff) * dVar18;
          dVar16 = dVar16 + (double)(uVar6 >> 0x18 & 0x7f) * dVar18;
          lVar13 = lVar13 + 1;
          pdVar12 = pdVar12 + 1;
          iVar10 = iVar10 + 1;
        } while (lVar13 < iVar9 + 2);
      }
      else {
        pdVar12 = local_98;
        lVar13 = (long)iVar2 + -1;
        iVar10 = iVar2;
        do {
          iVar3 = gdImageBoundsSafe(im,iVar10,(int)lVar11);
          uVar6 = bgColor;
          if ((iVar3 != 0) && (uVar6 = uVar7, im->tpixels[lVar11][lVar13 + 1] != im->transparent)) {
            uVar6 = im->tpixels[lVar11][lVar13 + 1];
          }
          dVar18 = *pdVar12 * dVar21;
          dVar20 = dVar20 + (double)(uVar6 >> 0x10 & 0xff) * dVar18;
          dVar17 = dVar17 + (double)(uVar6 >> 8 & 0xff) * dVar18;
          dVar19 = dVar19 + (double)(uVar6 & 0xff) * dVar18;
          dVar16 = dVar16 + (double)(uVar6 >> 0x18 & 0x7f) * dVar18;
          lVar13 = lVar13 + 1;
          pdVar12 = pdVar12 + 1;
          iVar10 = iVar10 + 1;
        } while (lVar13 < iVar9 + 2);
      }
      bVar15 = lVar11 < iVar14 + 2;
      lVar11 = lVar11 + 1;
    } while (bVar15);
    iVar9 = 0xff0000;
    if (dVar20 <= 255.0) {
      dVar21 = 0.0;
      if (0.0 <= dVar20) {
        dVar21 = dVar20;
      }
      iVar9 = (int)dVar21 << 0x10;
    }
    iVar14 = 0xff00;
    if (dVar17 <= 255.0) {
      dVar20 = 0.0;
      if (0.0 <= dVar17) {
        dVar20 = dVar17;
      }
      iVar14 = (int)dVar20 << 8;
    }
    iVar8 = 0xff;
    if (dVar19 <= 255.0) {
      dVar17 = 0.0;
      if (0.0 <= dVar19) {
        dVar17 = dVar19;
      }
      iVar8 = (int)dVar17;
    }
    iVar2 = 0x7f000000;
    if (dVar16 <= 127.0) {
      dVar19 = 0.0;
      if (0.0 <= dVar16) {
        dVar19 = dVar16;
      }
      iVar2 = (int)dVar19 << 0x18;
    }
    return iVar14 + iVar9 + iVar8 + iVar2;
  }
  iVar8 = im->trueColor;
  iVar2 = gdImageBoundsSafe(im,iVar9,iVar14);
  lVar11 = (long)iVar9;
  uVar7 = bgColor;
  if (iVar8 == 1) {
    if (iVar2 != 0) {
      uVar7 = 0x7f000000;
      if (bgColor != -1) {
        uVar7 = bgColor;
      }
      bVar15 = im->tpixels[iVar14][lVar11] == im->transparent;
      uVar6 = im->tpixels[iVar14][lVar11];
LAB_00117bac:
      if (!bVar15) {
        uVar7 = uVar6;
      }
    }
  }
  else if (iVar2 != 0) {
    bVar1 = im->pixels[iVar14][lVar11];
    if (im->transparent == (uint)bVar1) {
      bVar15 = bgColor == -1;
      uVar7 = 0x7f000000;
      uVar6 = bgColor;
      goto LAB_00117bac;
    }
    uVar7 = im->green[bVar1] * 0x100 + im->red[bVar1] * 0x10000 + im->alpha[bVar1] * 0x1000000 +
            im->blue[bVar1];
  }
  iVar8 = im->trueColor;
  iVar10 = (int)(lVar11 + -1);
  iVar2 = gdImageBoundsSafe(im,iVar10,iVar14);
  uVar6 = bgColor;
  if (iVar8 == 1) {
    if (iVar2 != 0) {
      uVar6 = 0x7f000000;
      if (bgColor != -1) {
        uVar6 = bgColor;
      }
      bVar15 = im->tpixels[iVar14][iVar10] == im->transparent;
      uVar4 = im->tpixels[iVar14][iVar10];
LAB_00117caa:
      if (!bVar15) {
        uVar6 = uVar4;
      }
    }
  }
  else if (iVar2 != 0) {
    bVar1 = im->pixels[iVar14][lVar11 + -1];
    if (im->transparent == (uint)bVar1) {
      bVar15 = bgColor == -1;
      uVar6 = 0x7f000000;
      uVar4 = bgColor;
      goto LAB_00117caa;
    }
    uVar6 = im->green[bVar1] * 0x100 + im->red[bVar1] * 0x10000 + im->alpha[bVar1] * 0x1000000 +
            im->blue[bVar1];
  }
  dVar16 = x - (double)iVar9;
  dVar19 = y - (double)iVar14;
  iVar8 = im->trueColor;
  iVar14 = iVar14 + -1;
  iVar2 = gdImageBoundsSafe(im,iVar9,iVar14);
  uVar4 = bgColor;
  if (iVar8 == 1) {
    if (iVar2 == 0) goto LAB_00117ddb;
    uVar4 = 0x7f000000;
    if (bgColor != -1) {
      uVar4 = bgColor;
    }
    bVar15 = im->tpixels[iVar14][lVar11] == im->transparent;
    uVar5 = im->tpixels[iVar14][lVar11];
  }
  else {
    if (iVar2 == 0) goto LAB_00117ddb;
    bVar1 = im->pixels[iVar14][lVar11];
    if (im->transparent != (uint)bVar1) {
      uVar4 = im->green[bVar1] * 0x100 + im->red[bVar1] * 0x10000 + im->alpha[bVar1] * 0x1000000 +
              im->blue[bVar1];
      goto LAB_00117ddb;
    }
    bVar15 = bgColor == -1;
    uVar4 = 0x7f000000;
    uVar5 = bgColor;
  }
  if (!bVar15) {
    uVar4 = uVar5;
  }
LAB_00117ddb:
  if (im->trueColor == 1) {
    iVar9 = gdImageBoundsSafe(im,iVar10,iVar14);
    local_134 = bgColor;
    if (iVar9 != 0) {
      local_134 = 0x7f000000;
      if (bgColor != -1) {
        local_134 = bgColor;
      }
      if (im->tpixels[iVar14][iVar10] != im->transparent) {
        local_134 = im->tpixels[iVar14][iVar10];
      }
    }
  }
  else {
    iVar9 = gdImageBoundsSafe(im,iVar9,iVar14);
    local_134 = bgColor;
    if (iVar9 != 0) {
      bVar1 = im->pixels[iVar14][lVar11];
      if (im->transparent == (uint)bVar1) {
        local_134 = bgColor;
        if (bgColor == -1) {
          local_134 = 0x7f000000;
        }
      }
      else {
        local_134 = im->green[bVar1] * 0x100 +
                    im->red[bVar1] * 0x10000 + im->alpha[bVar1] * 0x1000000 + im->blue[bVar1];
      }
    }
  }
  dVar17 = dVar16 * dVar19;
  dVar20 = dVar19 * (1.0 - dVar16);
  dVar21 = dVar16 * (1.0 - dVar19);
  dVar16 = (1.0 - dVar16) * (1.0 - dVar19);
  if (im->trueColor == 0) {
    lVar11 = (long)(int)local_134;
    dVar22 = (double)im->blue[lVar11] * dVar16 +
             dVar21 * (double)im->blue[(int)uVar4] +
             (double)im->blue[(int)uVar7] * dVar17 + dVar20 * (double)im->blue[(int)uVar6];
    dVar23 = (double)im->alpha[lVar11] * dVar16 +
             dVar21 * (double)im->alpha[(int)uVar4] +
             (double)im->alpha[(int)uVar7] * dVar17 + dVar20 * (double)im->alpha[(int)uVar6];
    dVar19 = dVar16 * (double)im->red[lVar11] +
             (double)im->red[(int)uVar4] * dVar21 +
             dVar17 * (double)im->red[(int)uVar7] + (double)im->red[(int)uVar6] * dVar20;
    dVar18 = dVar16 * (double)im->green[lVar11] +
             (double)im->green[(int)uVar4] * dVar21 +
             dVar17 * (double)im->green[(int)uVar7] + (double)im->green[(int)uVar6] * dVar20;
  }
  else {
    dVar19 = (double)(local_134 >> 0x10 & 0xff) * dVar16 +
             dVar21 * (double)(uVar4 >> 0x10 & 0xff) +
             (double)(uVar7 >> 0x10 & 0xff) * dVar17 + dVar20 * (double)(uVar6 >> 0x10 & 0xff);
    dVar18 = (double)(local_134 >> 8 & 0xff) * dVar16 +
             dVar21 * (double)(uVar4 >> 8 & 0xff) +
             (double)(uVar7 >> 8 & 0xff) * dVar17 + dVar20 * (double)(uVar6 >> 8 & 0xff);
    dVar22 = dVar16 * (double)(local_134 & 0xff) +
             (double)(uVar4 & 0xff) * dVar21 +
             dVar17 * (double)(uVar7 & 0xff) + (double)(uVar6 & 0xff) * dVar20;
    dVar23 = dVar16 * (double)(local_134 >> 0x18 & 0x7f) +
             (double)(uVar4 >> 0x18 & 0x7f) * dVar21 +
             dVar17 * (double)(uVar7 >> 0x18 & 0x7f) + (double)(uVar6 >> 0x18 & 0x7f) * dVar20;
  }
  uVar7 = (uint)dVar22;
  iVar9 = (int)dVar18;
  iVar14 = (int)dVar19;
  if ((int)dVar19 < 1) {
    iVar14 = 0;
  }
  if (0xfe < iVar14) {
    iVar14 = 0xff;
  }
  if (iVar9 < 1) {
    iVar9 = 0;
  }
  if (0xfe < iVar9) {
    iVar9 = 0xff;
  }
  if ((int)uVar7 < 1) {
    uVar7 = 0;
  }
  if (0xfe < (int)uVar7) {
    uVar7 = 0xff;
  }
  iVar8 = 0;
  if (0 < (int)dVar23) {
    iVar8 = (int)dVar23;
  }
  iVar2 = 0x7f;
  if (iVar8 < 0x7f) {
    iVar2 = iVar8;
  }
  return iVar9 << 8 | uVar7 | iVar14 << 0x10 | iVar2 << 0x18;
}

Assistant:

int getPixelInterpolated(gdImagePtr im, const double x, const double y, const int bgColor)
{
	const int xi=(int)(x);
	const int yi=(int)(y);
	int yii;
	int i;
	double kernel, kernel_cache_y;
	double kernel_x[12], kernel_y[4];
	double new_r = 0.0f, new_g = 0.0f, new_b = 0.0f, new_a = 0.0f;

	/* These methods use special implementations */
	if (im->interpolation_id == GD_NEAREST_NEIGHBOUR) {
		return -1;
	}

	if (im->interpolation_id == GD_WEIGHTED4) {
		return getPixelInterpolateWeight(im, x, y, bgColor);
	}

	if (im->interpolation_id == GD_NEAREST_NEIGHBOUR) {
		if (im->trueColor == 1) {
			return getPixelOverflowTC(im, xi, yi, bgColor);
		} else {
			return getPixelOverflowPalette(im, xi, yi, bgColor);
		}
	}
	if (im->interpolation) {
		for (i=0; i<4; i++) {
			kernel_x[i] = (double) im->interpolation((double)(xi+i-1-x));
			kernel_y[i] = (double) im->interpolation((double)(yi+i-1-y));
		}
	} else {
		return -1;
	}

	/*
	 * TODO: use the known fast rgba multiplication implementation once
	 * the new formats are in place
	 */
	for (yii = yi-1; yii < yi+3; yii++) {
		int xii;
		kernel_cache_y = kernel_y[yii-(yi-1)];
		if (im->trueColor) {
			for (xii=xi-1; xii<xi+3; xii++) {
				const int rgbs = getPixelOverflowTC(im, xii, yii, bgColor);

				kernel = kernel_cache_y * kernel_x[xii-(xi-1)];
				new_r += kernel * gdTrueColorGetRed(rgbs);
				new_g += kernel * gdTrueColorGetGreen(rgbs);
				new_b += kernel * gdTrueColorGetBlue(rgbs);
				new_a += kernel * gdTrueColorGetAlpha(rgbs);
			}
		} else {
			for (xii=xi-1; xii<xi+3; xii++) {
				const int rgbs = getPixelOverflowPalette(im, xii, yii, bgColor);

				kernel = kernel_cache_y * kernel_x[xii-(xi-1)];
				new_r += kernel * gdTrueColorGetRed(rgbs);
				new_g += kernel * gdTrueColorGetGreen(rgbs);
				new_b += kernel * gdTrueColorGetBlue(rgbs);
				new_a += kernel * gdTrueColorGetAlpha(rgbs);
			}
		}
	}

	new_r = CLAMP(new_r, 0, 255);
	new_g = CLAMP(new_g, 0, 255);
	new_b = CLAMP(new_b, 0, 255);
	new_a = CLAMP(new_a, 0, gdAlphaMax);

	return gdTrueColorAlpha(((int)new_r), ((int)new_g), ((int)new_b), ((int)new_a));
}